

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zpanel_bmod.c
# Opt level: O0

void zpanel_bmod(int m,int w,int jcol,int nseg,doublecomplex *dense,doublecomplex *tempv,int *segrep
                ,int *repfnz,GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  flops_t *pfVar13;
  int *piVar14;
  int *piVar15;
  int_t *piVar16;
  int_t *piVar17;
  void *pvVar18;
  int_t *piVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int ldm;
  int nrow_00;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  doublecomplex *pdVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  int local_2b8;
  int local_2b4;
  int local_2b0;
  double ci_19;
  double cr_19;
  double ci_18;
  double cr_18;
  double ci_17;
  double cr_17;
  double ci_16;
  double cr_16;
  double ci_15;
  double cr_15;
  double ci_14;
  double cr_14;
  double ci_13;
  double cr_13;
  double ci_12;
  double cr_12;
  double ci_11;
  double cr_11;
  double ci_10;
  double cr_10;
  double ci_9;
  double cr_9;
  double ci_8;
  double cr_8;
  double ci_7;
  double cr_7;
  double ci_6;
  double cr_6;
  double ci_5;
  double cr_5;
  double ci_4;
  double cr_4;
  double ci_3;
  double cr_3;
  double ci_2;
  double cr_2;
  double ci_1;
  double cr_1;
  double ci;
  double cr;
  flops_t *ops;
  int colblk;
  int rowblk;
  int maxsuper;
  int r_hi;
  int r_ind;
  int ldaTmp;
  doublecomplex comp_temp1;
  doublecomplex comp_temp;
  doublecomplex one;
  doublecomplex zero;
  doublecomplex *MatvecTmp;
  doublecomplex *TriTmp;
  doublecomplex *tempv1;
  doublecomplex *dense_col;
  int *repfnz_col;
  int_t *xlusup;
  doublecomplex *lusup;
  int_t *xlsub;
  int_t *lsub;
  int *supno;
  int *xsup;
  int local_a8;
  int jj;
  int i;
  int isub1;
  int isub;
  int no_zeros;
  int irow;
  int kfnz;
  int_t lptr;
  int block_nrow;
  int segsze;
  int_t luptr2;
  int_t luptr1;
  int_t luptr;
  doublecomplex ukj2;
  doublecomplex ukj1;
  doublecomplex ukj;
  int krep_ind;
  int krep;
  int nrow;
  int nsupr;
  int nsupc;
  int fsupc;
  int ksub;
  int k;
  doublecomplex *tempv_local;
  doublecomplex *dense_local;
  int nseg_local;
  int jcol_local;
  int w_local;
  int m_local;
  
  memset(&one.i,0,0x10);
  one.r = 0.0;
  pfVar13 = stat->ops;
  piVar14 = Glu->xsup;
  piVar15 = Glu->supno;
  piVar16 = Glu->lsub;
  piVar17 = Glu->xlsub;
  pvVar18 = Glu->lusup;
  piVar19 = Glu->xlusup;
  iVar20 = sp_ienv(3);
  iVar21 = sp_ienv(7);
  if (iVar21 < iVar20) {
    local_2b0 = sp_ienv(3);
  }
  else {
    local_2b0 = sp_ienv(7);
  }
  iVar20 = sp_ienv(4);
  iVar21 = sp_ienv(5);
  iVar22 = local_2b0 + iVar20;
  fsupc = nseg + -1;
  for (nsupc = 0; nsupc < nseg; nsupc = nsupc + 1) {
    iVar9 = segrep[fsupc];
    iVar10 = piVar14[piVar15[iVar9]];
    iVar23 = iVar9 - iVar10;
    iVar24 = iVar23 + 1;
    ldm = piVar17[iVar10 + 1] - piVar17[iVar10];
    nrow_00 = ldm - iVar24;
    iVar11 = piVar17[iVar10];
    iVar25 = iVar11 + iVar24;
    iVar26 = iVar25 + -1;
    dense_col = (doublecomplex *)repfnz;
    tempv1 = dense;
    xsup._4_4_ = jcol;
    if ((iVar24 < iVar21) || (MatvecTmp = tempv, nrow_00 <= iVar20)) {
      for (; xsup._4_4_ < jcol + w; xsup._4_4_ = xsup._4_4_ + 1) {
        iVar28 = *(int *)((long)&dense_col->r + (long)iVar9 * 4);
        if (iVar28 != -1) {
          iVar27 = (iVar9 - iVar28) + 1;
          iVar29 = piVar19[iVar10];
          pfVar13[0x13] = (float)(iVar27 * 4 * (iVar9 - iVar28)) + pfVar13[0x13];
          pfVar13[0x14] = (float)(nrow_00 * 8 * iVar27) + pfVar13[0x14];
          if (iVar27 == 1) {
            dVar31 = tempv1[piVar16[iVar26]].r;
            dVar32 = tempv1[piVar16[iVar26]].i;
            luptr2 = ldm * iVar23 + iVar24 + iVar29;
            for (local_a8 = iVar11 + iVar24; local_a8 < piVar17[iVar10 + 1]; local_a8 = local_a8 + 1
                ) {
              iVar28 = piVar16[local_a8];
              dVar33 = *(double *)((long)pvVar18 + (long)luptr2 * 0x10);
              dVar34 = *(double *)((long)pvVar18 + (long)luptr2 * 0x10 + 8);
              tempv1[iVar28].r =
                   tempv1[iVar28].r -
                   (dVar31 * *(double *)((long)pvVar18 + (long)luptr2 * 0x10) +
                   -(dVar32 * *(double *)((long)pvVar18 + (long)luptr2 * 0x10 + 8)));
              tempv1[iVar28].i = tempv1[iVar28].i - (dVar32 * dVar33 + dVar31 * dVar34);
              luptr2 = luptr2 + 1;
            }
          }
          else if (iVar27 < 4) {
            dVar31 = tempv1[piVar16[iVar26]].r;
            dVar32 = tempv1[piVar16[iVar26]].i;
            luptr2 = ldm * iVar23 + iVar24 + -1 + iVar29;
            dVar33 = tempv1[piVar16[iVar25 + -2]].r;
            dVar34 = tempv1[piVar16[iVar25 + -2]].i;
            segsze = luptr2 - ldm;
            if (iVar27 == 2) {
              dVar31 = dVar31 - (dVar33 * *(double *)((long)pvVar18 + (long)segsze * 0x10) +
                                -(dVar34 * *(double *)((long)pvVar18 + (long)segsze * 0x10 + 8)));
              dVar32 = dVar32 - (dVar34 * *(double *)((long)pvVar18 + (long)segsze * 0x10) +
                                dVar33 * *(double *)((long)pvVar18 + (long)segsze * 0x10 + 8));
              iVar28 = piVar16[iVar26];
              tempv1[iVar28].r = dVar31;
              tempv1[iVar28].i = dVar32;
              for (local_a8 = iVar11 + iVar24; local_a8 < piVar17[iVar10 + 1];
                  local_a8 = local_a8 + 1) {
                iVar28 = piVar16[local_a8];
                luptr2 = luptr2 + 1;
                segsze = segsze + 1;
                dVar1 = *(double *)((long)pvVar18 + (long)luptr2 * 0x10);
                dVar2 = *(double *)((long)pvVar18 + (long)luptr2 * 0x10 + 8);
                dVar3 = *(double *)((long)pvVar18 + (long)segsze * 0x10);
                dVar4 = *(double *)((long)pvVar18 + (long)segsze * 0x10 + 8);
                tempv1[iVar28].r =
                     tempv1[iVar28].r -
                     (dVar31 * *(double *)((long)pvVar18 + (long)luptr2 * 0x10) +
                      -(dVar32 * *(double *)((long)pvVar18 + (long)luptr2 * 0x10 + 8)) +
                     dVar33 * *(double *)((long)pvVar18 + (long)segsze * 0x10) +
                     -(dVar34 * *(double *)((long)pvVar18 + (long)segsze * 0x10 + 8)));
                tempv1[iVar28].i =
                     tempv1[iVar28].i -
                     (dVar32 * dVar1 + dVar31 * dVar2 + dVar34 * dVar3 + dVar33 * dVar4);
              }
            }
            else {
              dVar1 = tempv1[piVar16[iVar25 + -3]].r;
              dVar2 = tempv1[piVar16[iVar25 + -3]].i;
              block_nrow = segsze - ldm;
              dVar33 = dVar33 - (dVar1 * *(double *)((long)pvVar18 + (long)(block_nrow + -1) * 0x10)
                                + -(dVar2 * *(double *)
                                             ((long)pvVar18 + (long)(block_nrow + -1) * 0x10 + 8)));
              dVar34 = dVar34 - (dVar2 * *(double *)((long)pvVar18 + (long)(block_nrow + -1) * 0x10)
                                + dVar1 * *(double *)
                                           ((long)pvVar18 + (long)(block_nrow + -1) * 0x10 + 8));
              dVar31 = dVar31 - (dVar33 * *(double *)((long)pvVar18 + (long)segsze * 0x10) +
                                 -(dVar34 * *(double *)((long)pvVar18 + (long)segsze * 0x10 + 8)) +
                                dVar1 * *(double *)((long)pvVar18 + (long)block_nrow * 0x10) +
                                -(dVar2 * *(double *)((long)pvVar18 + (long)block_nrow * 0x10 + 8)))
              ;
              dVar32 = dVar32 - (dVar34 * *(double *)((long)pvVar18 + (long)segsze * 0x10) +
                                 dVar33 * *(double *)((long)pvVar18 + (long)segsze * 0x10 + 8) +
                                dVar2 * *(double *)((long)pvVar18 + (long)block_nrow * 0x10) +
                                dVar1 * *(double *)((long)pvVar18 + (long)block_nrow * 0x10 + 8));
              iVar28 = piVar16[iVar26];
              tempv1[iVar28].r = dVar31;
              tempv1[iVar28].i = dVar32;
              iVar28 = piVar16[iVar25 + -2];
              tempv1[iVar28].r = dVar33;
              tempv1[iVar28].i = dVar34;
              for (local_a8 = iVar11 + iVar24; local_a8 < piVar17[iVar10 + 1];
                  local_a8 = local_a8 + 1) {
                iVar28 = piVar16[local_a8];
                luptr2 = luptr2 + 1;
                segsze = segsze + 1;
                block_nrow = block_nrow + 1;
                dVar3 = *(double *)((long)pvVar18 + (long)luptr2 * 0x10);
                dVar4 = *(double *)((long)pvVar18 + (long)luptr2 * 0x10 + 8);
                dVar5 = *(double *)((long)pvVar18 + (long)segsze * 0x10);
                dVar6 = *(double *)((long)pvVar18 + (long)segsze * 0x10 + 8);
                dVar7 = *(double *)((long)pvVar18 + (long)block_nrow * 0x10);
                dVar8 = *(double *)((long)pvVar18 + (long)block_nrow * 0x10 + 8);
                tempv1[iVar28].r =
                     tempv1[iVar28].r -
                     (dVar31 * *(double *)((long)pvVar18 + (long)luptr2 * 0x10) +
                      -(dVar32 * *(double *)((long)pvVar18 + (long)luptr2 * 0x10 + 8)) +
                      dVar33 * *(double *)((long)pvVar18 + (long)segsze * 0x10) +
                      -(dVar34 * *(double *)((long)pvVar18 + (long)segsze * 0x10 + 8)) +
                     dVar1 * *(double *)((long)pvVar18 + (long)block_nrow * 0x10) +
                     -(dVar2 * *(double *)((long)pvVar18 + (long)block_nrow * 0x10 + 8)));
                tempv1[iVar28].i =
                     tempv1[iVar28].i -
                     (dVar32 * dVar3 + dVar31 * dVar4 + dVar34 * dVar5 + dVar33 * dVar6 +
                     dVar2 * dVar7 + dVar1 * dVar8);
              }
            }
          }
          else {
            iVar28 = iVar28 - iVar10;
            i = iVar11 + iVar28;
            for (local_a8 = 0; local_a8 < iVar27; local_a8 = local_a8 + 1) {
              iVar12 = piVar16[i];
              tempv[local_a8].r = tempv1[iVar12].r;
              tempv[local_a8].i = tempv1[iVar12].i;
              i = i + 1;
            }
            iVar29 = ldm * iVar28 + iVar28 + iVar29;
            zlsolve(ldm,iVar27,(doublecomplex *)((long)pvVar18 + (long)iVar29 * 0x10),tempv);
            pdVar30 = tempv + iVar27;
            zmatvec(ldm,nrow_00,iVar27,
                    (doublecomplex *)((long)pvVar18 + (long)(iVar27 + iVar29) * 0x10),tempv,pdVar30)
            ;
            i = iVar11 + iVar28;
            for (local_a8 = 0; local_a8 < iVar27; local_a8 = local_a8 + 1) {
              iVar28 = piVar16[i];
              tempv1[iVar28].r = tempv[local_a8].r;
              tempv1[iVar28].i = tempv[local_a8].i;
              tempv[local_a8].r = one.i;
              tempv[local_a8].i = zero.r;
              i = i + 1;
            }
            for (local_a8 = 0; local_a8 < nrow_00; local_a8 = local_a8 + 1) {
              iVar28 = piVar16[i];
              tempv1[iVar28].r = tempv1[iVar28].r - pdVar30[local_a8].r;
              tempv1[iVar28].i = tempv1[iVar28].i - pdVar30[local_a8].i;
              pdVar30[local_a8].r = one.i;
              pdVar30[local_a8].i = zero.r;
              i = i + 1;
            }
          }
        }
        dense_col = (doublecomplex *)((long)&dense_col->r + (long)m * 4);
        tempv1 = tempv1 + m;
      }
    }
    else {
      for (; xsup._4_4_ < jcol + w; xsup._4_4_ = xsup._4_4_ + 1) {
        iVar28 = *(int *)((long)&dense_col->r + (long)iVar9 * 4);
        if (iVar28 != -1) {
          iVar27 = (iVar9 - iVar28) + 1;
          iVar29 = piVar19[iVar10];
          pfVar13[0x13] = (float)(iVar27 * 4 * (iVar9 - iVar28)) + pfVar13[0x13];
          pfVar13[0x14] = (float)(nrow_00 * 8 * iVar27) + pfVar13[0x14];
          if (iVar27 == 1) {
            dVar31 = tempv1[piVar16[iVar26]].r;
            dVar32 = tempv1[piVar16[iVar26]].i;
            luptr2 = ldm * iVar23 + iVar24 + iVar29;
            for (local_a8 = iVar11 + iVar24; local_a8 < piVar17[iVar10 + 1]; local_a8 = local_a8 + 1
                ) {
              iVar28 = piVar16[local_a8];
              dVar33 = *(double *)((long)pvVar18 + (long)luptr2 * 0x10);
              dVar34 = *(double *)((long)pvVar18 + (long)luptr2 * 0x10 + 8);
              tempv1[iVar28].r =
                   tempv1[iVar28].r -
                   (dVar31 * *(double *)((long)pvVar18 + (long)luptr2 * 0x10) +
                   -(dVar32 * *(double *)((long)pvVar18 + (long)luptr2 * 0x10 + 8)));
              tempv1[iVar28].i = tempv1[iVar28].i - (dVar32 * dVar33 + dVar31 * dVar34);
              luptr2 = luptr2 + 1;
            }
          }
          else if (iVar27 < 4) {
            dVar31 = tempv1[piVar16[iVar26]].r;
            dVar32 = tempv1[piVar16[iVar26]].i;
            dVar33 = tempv1[piVar16[iVar25 + -2]].r;
            dVar34 = tempv1[piVar16[iVar25 + -2]].i;
            luptr2 = ldm * iVar23 + iVar24 + -1 + iVar29;
            segsze = luptr2 - ldm;
            if (iVar27 == 2) {
              dVar31 = dVar31 - (dVar33 * *(double *)((long)pvVar18 + (long)segsze * 0x10) +
                                -(dVar34 * *(double *)((long)pvVar18 + (long)segsze * 0x10 + 8)));
              dVar32 = dVar32 - (dVar34 * *(double *)((long)pvVar18 + (long)segsze * 0x10) +
                                dVar33 * *(double *)((long)pvVar18 + (long)segsze * 0x10 + 8));
              iVar28 = piVar16[iVar26];
              tempv1[iVar28].r = dVar31;
              tempv1[iVar28].i = dVar32;
              for (local_a8 = iVar11 + iVar24; local_a8 < piVar17[iVar10 + 1];
                  local_a8 = local_a8 + 1) {
                iVar28 = piVar16[local_a8];
                luptr2 = luptr2 + 1;
                segsze = segsze + 1;
                dVar1 = *(double *)((long)pvVar18 + (long)luptr2 * 0x10);
                dVar2 = *(double *)((long)pvVar18 + (long)luptr2 * 0x10 + 8);
                dVar3 = *(double *)((long)pvVar18 + (long)segsze * 0x10);
                dVar4 = *(double *)((long)pvVar18 + (long)segsze * 0x10 + 8);
                tempv1[iVar28].r =
                     tempv1[iVar28].r -
                     (dVar31 * *(double *)((long)pvVar18 + (long)luptr2 * 0x10) +
                      -(dVar32 * *(double *)((long)pvVar18 + (long)luptr2 * 0x10 + 8)) +
                     dVar33 * *(double *)((long)pvVar18 + (long)segsze * 0x10) +
                     -(dVar34 * *(double *)((long)pvVar18 + (long)segsze * 0x10 + 8)));
                tempv1[iVar28].i =
                     tempv1[iVar28].i -
                     (dVar32 * dVar1 + dVar31 * dVar2 + dVar34 * dVar3 + dVar33 * dVar4);
              }
            }
            else {
              dVar1 = tempv1[piVar16[iVar25 + -3]].r;
              dVar2 = tempv1[piVar16[iVar25 + -3]].i;
              block_nrow = segsze - ldm;
              dVar33 = dVar33 - (dVar1 * *(double *)((long)pvVar18 + (long)(block_nrow + -1) * 0x10)
                                + -(dVar2 * *(double *)
                                             ((long)pvVar18 + (long)(block_nrow + -1) * 0x10 + 8)));
              dVar34 = dVar34 - (dVar2 * *(double *)((long)pvVar18 + (long)(block_nrow + -1) * 0x10)
                                + dVar1 * *(double *)
                                           ((long)pvVar18 + (long)(block_nrow + -1) * 0x10 + 8));
              dVar31 = dVar31 - (dVar33 * *(double *)((long)pvVar18 + (long)segsze * 0x10) +
                                 -(dVar34 * *(double *)((long)pvVar18 + (long)segsze * 0x10 + 8)) +
                                dVar1 * *(double *)((long)pvVar18 + (long)block_nrow * 0x10) +
                                -(dVar2 * *(double *)((long)pvVar18 + (long)block_nrow * 0x10 + 8)))
              ;
              dVar32 = dVar32 - (dVar34 * *(double *)((long)pvVar18 + (long)segsze * 0x10) +
                                 dVar33 * *(double *)((long)pvVar18 + (long)segsze * 0x10 + 8) +
                                dVar2 * *(double *)((long)pvVar18 + (long)block_nrow * 0x10) +
                                dVar1 * *(double *)((long)pvVar18 + (long)block_nrow * 0x10 + 8));
              iVar28 = piVar16[iVar26];
              tempv1[iVar28].r = dVar31;
              tempv1[iVar28].i = dVar32;
              iVar28 = piVar16[iVar25 + -2];
              tempv1[iVar28].r = dVar33;
              tempv1[iVar28].i = dVar34;
              for (local_a8 = iVar11 + iVar24; local_a8 < piVar17[iVar10 + 1];
                  local_a8 = local_a8 + 1) {
                iVar28 = piVar16[local_a8];
                luptr2 = luptr2 + 1;
                segsze = segsze + 1;
                block_nrow = block_nrow + 1;
                dVar3 = *(double *)((long)pvVar18 + (long)luptr2 * 0x10);
                dVar4 = *(double *)((long)pvVar18 + (long)luptr2 * 0x10 + 8);
                dVar5 = *(double *)((long)pvVar18 + (long)segsze * 0x10);
                dVar6 = *(double *)((long)pvVar18 + (long)segsze * 0x10 + 8);
                dVar7 = *(double *)((long)pvVar18 + (long)block_nrow * 0x10);
                dVar8 = *(double *)((long)pvVar18 + (long)block_nrow * 0x10 + 8);
                tempv1[iVar28].r =
                     tempv1[iVar28].r -
                     (dVar31 * *(double *)((long)pvVar18 + (long)luptr2 * 0x10) +
                      -(dVar32 * *(double *)((long)pvVar18 + (long)luptr2 * 0x10 + 8)) +
                      dVar33 * *(double *)((long)pvVar18 + (long)segsze * 0x10) +
                      -(dVar34 * *(double *)((long)pvVar18 + (long)segsze * 0x10 + 8)) +
                     dVar1 * *(double *)((long)pvVar18 + (long)block_nrow * 0x10) +
                     -(dVar2 * *(double *)((long)pvVar18 + (long)block_nrow * 0x10 + 8)));
                tempv1[iVar28].i =
                     tempv1[iVar28].i -
                     (dVar32 * dVar3 + dVar31 * dVar4 + dVar34 * dVar5 + dVar33 * dVar6 +
                     dVar2 * dVar7 + dVar1 * dVar8);
              }
            }
          }
          else {
            iVar28 = iVar28 - iVar10;
            i = iVar11 + iVar28;
            for (local_a8 = 0; local_a8 < iVar27; local_a8 = local_a8 + 1) {
              iVar12 = piVar16[i];
              MatvecTmp[local_a8].r = tempv1[iVar12].r;
              MatvecTmp[local_a8].i = tempv1[iVar12].i;
              i = i + 1;
            }
            zlsolve(ldm,iVar27,
                    (doublecomplex *)((long)pvVar18 + (long)(ldm * iVar28 + iVar28 + iVar29) * 0x10)
                    ,MatvecTmp);
          }
        }
        dense_col = (doublecomplex *)((long)&dense_col->r + (long)m * 4);
        tempv1 = tempv1 + m;
        MatvecTmp = MatvecTmp + iVar22;
      }
      for (maxsuper = 0; maxsuper < nrow_00; maxsuper = iVar20 + maxsuper) {
        local_2b4 = nrow_00;
        if (maxsuper + iVar20 <= nrow_00) {
          local_2b4 = maxsuper + iVar20;
        }
        local_2b8 = iVar20;
        if (local_2b4 - maxsuper <= iVar20) {
          local_2b8 = local_2b4 - maxsuper;
        }
        iVar23 = piVar19[iVar10];
        dense_col = (doublecomplex *)repfnz;
        MatvecTmp = tempv;
        tempv1 = dense;
        for (xsup._4_4_ = jcol; xsup._4_4_ < jcol + w; xsup._4_4_ = xsup._4_4_ + 1) {
          iVar25 = *(int *)((long)&dense_col->r + (long)iVar9 * 4);
          if ((iVar25 != -1) && (iVar26 = (iVar9 - iVar25) + 1, 3 < iVar26)) {
            pdVar30 = MatvecTmp + local_2b0;
            zmatvec(ldm,local_2b8,iVar26,
                    (doublecomplex *)
                    ((long)pvVar18 +
                    (long)(iVar23 + iVar24 + maxsuper + ldm * (iVar25 - iVar10)) * 0x10),MatvecTmp,
                    pdVar30);
            i = iVar11 + iVar24 + maxsuper;
            for (local_a8 = 0; local_a8 < local_2b8; local_a8 = local_a8 + 1) {
              iVar25 = piVar16[i];
              tempv1[iVar25].r = tempv1[iVar25].r - pdVar30[local_a8].r;
              tempv1[iVar25].i = tempv1[iVar25].i - pdVar30[local_a8].i;
              pdVar30[local_a8].r = one.i;
              pdVar30[local_a8].i = zero.r;
              i = i + 1;
            }
          }
          dense_col = (doublecomplex *)((long)&dense_col->r + (long)m * 4);
          tempv1 = tempv1 + m;
          MatvecTmp = MatvecTmp + iVar22;
        }
      }
      dense_col = (doublecomplex *)repfnz;
      MatvecTmp = tempv;
      tempv1 = dense;
      for (xsup._4_4_ = jcol; xsup._4_4_ < jcol + w; xsup._4_4_ = xsup._4_4_ + 1) {
        iVar23 = *(int *)((long)&dense_col->r + (long)iVar9 * 4);
        if ((iVar23 != -1) && (iVar24 = (iVar9 - iVar23) + 1, 3 < iVar24)) {
          i = iVar11 + (iVar23 - iVar10);
          for (local_a8 = 0; local_a8 < iVar24; local_a8 = local_a8 + 1) {
            iVar23 = piVar16[i];
            tempv1[iVar23].r = MatvecTmp[local_a8].r;
            tempv1[iVar23].i = MatvecTmp[local_a8].i;
            MatvecTmp[local_a8].r = one.i;
            MatvecTmp[local_a8].i = zero.r;
            i = i + 1;
          }
        }
        dense_col = (doublecomplex *)((long)&dense_col->r + (long)m * 4);
        tempv1 = tempv1 + m;
        MatvecTmp = MatvecTmp + iVar22;
      }
    }
    fsupc = fsupc + -1;
  }
  return;
}

Assistant:

void
zpanel_bmod (
	    const int  m,          /* in - number of rows in the matrix */
	    const int  w,          /* in */
	    const int  jcol,       /* in */
	    const int  nseg,       /* in */
	    doublecomplex     *dense,     /* out, of size n by w */
	    doublecomplex     *tempv,     /* working array */
	    int        *segrep,    /* in */
	    int        *repfnz,    /* in, of size n by w */
	    GlobalLU_t *Glu,       /* modified */
	    SuperLUStat_t *stat    /* output */
	    )
{


#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
         ftcs2 = _cptofcd("N", strlen("N")),
         ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int          incx = 1, incy = 1;
    doublecomplex       alpha, beta;
#endif

    register int k, ksub;
    int          fsupc, nsupc, nsupr, nrow;
    int          krep, krep_ind;
    doublecomplex       ukj, ukj1, ukj2;
    int_t        luptr, luptr1, luptr2;
    int          segsze;
    int          block_nrow;  /* no of rows in a block row */
    int_t        lptr;	      /* Points to the row subscripts of a supernode */
    int          kfnz, irow, no_zeros; 
    register int isub, isub1, i;
    register int jj;	      /* Index through each column in the panel */
    int          *xsup, *supno;
    int_t        *lsub, *xlsub;
    doublecomplex       *lusup;
    int_t        *xlusup;
    int          *repfnz_col; /* repfnz[] for a column in the panel */
    doublecomplex       *dense_col;  /* dense[] for a column in the panel */
    doublecomplex       *tempv1;             /* Used in 1-D update */
    doublecomplex       *TriTmp, *MatvecTmp; /* used in 2-D update */
    doublecomplex      zero = {0.0, 0.0};
    doublecomplex      one = {1.0, 0.0};
    doublecomplex      comp_temp, comp_temp1;
    register int ldaTmp;
    register int r_ind, r_hi;
    int  maxsuper, rowblk, colblk;
    flops_t  *ops = stat->ops;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (doublecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;
    
    maxsuper = SUPERLU_MAX( sp_ienv(3), sp_ienv(7) );
    rowblk   = sp_ienv(4);
    colblk   = sp_ienv(5);
    ldaTmp   = maxsuper + rowblk;

    /* 
     * For each nonz supernode segment of U[*,j] in topological order 
     */
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) { /* for each updating supernode */

	/* krep = representative of current k-th supernode
	 * fsupc = first supernodal column
	 * nsupc = no of columns in a supernode
	 * nsupr = no of rows in a supernode
	 */
        krep = segrep[k--];
	fsupc = xsup[supno[krep]];
	nsupc = krep - fsupc + 1;
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];
	nrow = nsupr - nsupc;
	lptr = xlsub[fsupc];
	krep_ind = lptr + nsupc - 1;

	repfnz_col = repfnz;
	dense_col = dense;
	
	if ( nsupc >= colblk && nrow > rowblk ) { /* 2-D block update */

	    TriTmp = tempv;
	
	    /* Sequence through each column in panel -- triangular solves */
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m, TriTmp += ldaTmp ) {

		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue;	/* Skip any zero segment */
	    
		segsze = krep - kfnz + 1;
		luptr = xlusup[fsupc];

		ops[TRSV] += 4 * segsze * (segsze - 1);
		ops[GEMV] += 8 * nrow * segsze;
	
		/* Case 1: Update U-segment of size 1 -- col-col update */
		if ( segsze == 1 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc;

		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; i++) {
			irow = lsub[i];
	    	        zz_mult(&comp_temp, &ukj, &lusup[luptr]);
		        z_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			++luptr;
		    }

		} else if ( segsze <= 3 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    ukj1 = dense_col[lsub[krep_ind - 1]];
		    luptr += nsupr*(nsupc-1) + nsupc-1;
		    luptr1 = luptr - nsupr;

		    if ( segsze == 2 ) {
		        zz_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		        z_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    luptr++; luptr1++;
			    zz_mult(&comp_temp, &ukj, &lusup[luptr]);
			    zz_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    z_add(&comp_temp, &comp_temp, &comp_temp1);
			    z_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    } else {
			ukj2 = dense_col[lsub[krep_ind - 2]];
			luptr2 = luptr1 - nsupr;
  		        zz_mult(&comp_temp, &ukj2, &lusup[luptr2-1]);
		        z_sub(&ukj1, &ukj1, &comp_temp);

		        zz_mult(&comp_temp, &ukj1, &lusup[luptr1]);
        		zz_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
		        z_add(&comp_temp, &comp_temp, &comp_temp1);
		        z_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			dense_col[lsub[krep_ind-1]] = ukj1;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    luptr++; luptr1++; luptr2++;
			    zz_mult(&comp_temp, &ukj, &lusup[luptr]);
			    zz_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    z_add(&comp_temp, &comp_temp, &comp_temp1);
			    zz_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
			    z_add(&comp_temp, &comp_temp, &comp_temp1);
			    z_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    }

		} else  {	/* segsze >= 4 */
		    
		    /* Copy U[*,j] segment from dense[*] to TriTmp[*], which
		       holds the result of triangular solves.    */
		    no_zeros = kfnz - fsupc;
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; ++i) {
			irow = lsub[isub];
			TriTmp[i] = dense_col[irow]; /* Gather */
			++isub;
		    }
		    
		    /* start effective triangle */
		    luptr += nsupr * no_zeros + no_zeros;

#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
			   &nsupr, TriTmp, &incx );
#else
		    ztrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
			   &nsupr, TriTmp, &incx );
#endif
#else		
		    zlsolve ( nsupr, segsze, &lusup[luptr], TriTmp );
#endif
		    

		} /* else ... */
	    
	    }  /* for jj ... end tri-solves */

	    /* Block row updates; push all the way into dense[*] block */
	    for ( r_ind = 0; r_ind < nrow; r_ind += rowblk ) {
		
		r_hi = SUPERLU_MIN(nrow, r_ind + rowblk);
		block_nrow = SUPERLU_MIN(rowblk, r_hi - r_ind);
		luptr = xlusup[fsupc] + nsupc + r_ind;
		isub1 = lptr + nsupc + r_ind;
		
		repfnz_col = repfnz;
		TriTmp = tempv;
		dense_col = dense;
		
		/* Sequence through each column in panel -- matrix-vector */
		for (jj = jcol; jj < jcol + w; jj++,
		     repfnz_col += m, dense_col += m, TriTmp += ldaTmp) {
		    
		    kfnz = repfnz_col[krep];
		    if ( kfnz == SLU_EMPTY ) continue; /* Skip any zero segment */
		    
		    segsze = krep - kfnz + 1;
		    if ( segsze <= 3 ) continue;   /* skip unrolled cases */
		    
		    /* Perform a block update, and scatter the result of
		       matrix-vector to dense[].		 */
		    no_zeros = kfnz - fsupc;
		    luptr1 = luptr + nsupr * no_zeros;
		    MatvecTmp = &TriTmp[maxsuper];
		    
#ifdef USE_VENDOR_BLAS
		    alpha = one; 
                    beta = zero;
#ifdef _CRAY
		    CGEMV(ftcs2, &block_nrow, &segsze, &alpha, &lusup[luptr1], 
			   &nsupr, TriTmp, &incx, &beta, MatvecTmp, &incy);
#else
		    zgemv_("N", &block_nrow, &segsze, &alpha, &lusup[luptr1], 
			   &nsupr, TriTmp, &incx, &beta, MatvecTmp, &incy);
#endif
#else
		    zmatvec(nsupr, block_nrow, segsze, &lusup[luptr1],
			   TriTmp, MatvecTmp);
#endif
		    
		    /* Scatter MatvecTmp[*] into SPA dense[*] temporarily
		     * such that MatvecTmp[*] can be re-used for the
		     * the next blok row update. dense[] will be copied into 
		     * global store after the whole panel has been finished.
		     */
		    isub = isub1;
		    for (i = 0; i < block_nrow; i++) {
			irow = lsub[isub];
		        z_sub(&dense_col[irow], &dense_col[irow], 
                              &MatvecTmp[i]);
			MatvecTmp[i] = zero;
			++isub;
		    }
		    
		} /* for jj ... */
		
	    } /* for each block row ... */
	    
	    /* Scatter the triangular solves into SPA dense[*] */
	    repfnz_col = repfnz;
	    TriTmp = tempv;
	    dense_col = dense;
	    
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m, TriTmp += ldaTmp) {
		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue; /* Skip any zero segment */
		
		segsze = krep - kfnz + 1;
		if ( segsze <= 3 ) continue; /* skip unrolled cases */
		
		no_zeros = kfnz - fsupc;		
		isub = lptr + no_zeros;
		for (i = 0; i < segsze; i++) {
		    irow = lsub[isub];
		    dense_col[irow] = TriTmp[i];
		    TriTmp[i] = zero;
		    ++isub;
		}
		
	    } /* for jj ... */
	    
	} else { /* 1-D block modification */
	    
	    
	    /* Sequence through each column in the panel */
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m) {
		
		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue;	/* Skip any zero segment */
		
		segsze = krep - kfnz + 1;
		luptr = xlusup[fsupc];

		ops[TRSV] += 4 * segsze * (segsze - 1);
		ops[GEMV] += 8 * nrow * segsze;
		
		/* Case 1: Update U-segment of size 1 -- col-col update */
		if ( segsze == 1 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc;

		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; i++) {
			irow = lsub[i];
	    	        zz_mult(&comp_temp, &ukj, &lusup[luptr]);
		        z_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			++luptr;
		    }

		} else if ( segsze <= 3 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc-1;
		    ukj1 = dense_col[lsub[krep_ind - 1]];
		    luptr1 = luptr - nsupr;

		    if ( segsze == 2 ) {
		        zz_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		        z_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    ++luptr;  ++luptr1;
			    zz_mult(&comp_temp, &ukj, &lusup[luptr]);
			    zz_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    z_add(&comp_temp, &comp_temp, &comp_temp1);
			    z_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    } else {
			ukj2 = dense_col[lsub[krep_ind - 2]];
			luptr2 = luptr1 - nsupr;
  		        zz_mult(&comp_temp, &ukj2, &lusup[luptr2-1]);
		        z_sub(&ukj1, &ukj1, &comp_temp);

		        zz_mult(&comp_temp, &ukj1, &lusup[luptr1]);
        		zz_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
		        z_add(&comp_temp, &comp_temp, &comp_temp1);
		        z_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			dense_col[lsub[krep_ind-1]] = ukj1;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    ++luptr; ++luptr1; ++luptr2;
			    zz_mult(&comp_temp, &ukj, &lusup[luptr]);
			    zz_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    z_add(&comp_temp, &comp_temp, &comp_temp1);
			    zz_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
			    z_add(&comp_temp, &comp_temp, &comp_temp1);
			    z_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    }

		} else  { /* segsze >= 4 */
		    /* 
		     * Perform a triangular solve and block update,
		     * then scatter the result of sup-col update to dense[].
		     */
		    no_zeros = kfnz - fsupc;
		    
		    /* Copy U[*,j] segment from dense[*] to tempv[*]: 
		     *    The result of triangular solve is in tempv[*];
		     *    The result of matrix vector update is in dense_col[*]
		     */
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; ++i) {
			irow = lsub[isub];
			tempv[i] = dense_col[irow]; /* Gather */
			++isub;
		    }
		    
		    /* start effective triangle */
		    luptr += nsupr * no_zeros + no_zeros;
		    
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
			   &nsupr, tempv, &incx );
#else
		    ztrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
			   &nsupr, tempv, &incx );
#endif
		    
		    luptr += segsze;	/* Dense matrix-vector */
		    tempv1 = &tempv[segsze];
                    alpha = one;
                    beta = zero;
#ifdef _CRAY
		    CGEMV( ftcs2, &nrow, &segsze, &alpha, &lusup[luptr], 
			   &nsupr, tempv, &incx, &beta, tempv1, &incy );
#else
		    zgemv_( "N", &nrow, &segsze, &alpha, &lusup[luptr], 
			   &nsupr, tempv, &incx, &beta, tempv1, &incy );
#endif
#else
		    zlsolve ( nsupr, segsze, &lusup[luptr], tempv );
		    
		    luptr += segsze;        /* Dense matrix-vector */
		    tempv1 = &tempv[segsze];
		    zmatvec (nsupr, nrow, segsze, &lusup[luptr], tempv, tempv1);
#endif
		    
		    /* Scatter tempv[*] into SPA dense[*] temporarily, such
		     * that tempv[*] can be used for the triangular solve of
		     * the next column of the panel. They will be copied into 
		     * ucol[*] after the whole panel has been finished.
		     */
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; i++) {
			irow = lsub[isub];
			dense_col[irow] = tempv[i];
			tempv[i] = zero;
			isub++;
		    }
		    
		    /* Scatter the update from tempv1[*] into SPA dense[*] */
		    /* Start dense rectangular L */
		    for (i = 0; i < nrow; i++) {
			irow = lsub[isub];
		        z_sub(&dense_col[irow], &dense_col[irow], &tempv1[i]);
			tempv1[i] = zero;
			++isub;	
		    }
		    
		} /* else segsze>=4 ... */
		
	    } /* for each column in the panel... */
	    
	} /* else 1-D update ... */

    } /* for each updating supernode ... */

}